

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O3

LBBox3fa * __thiscall
embree::Geometry::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,Geometry *this,size_t primID,BBox1f *time_range)

{
  undefined8 *puVar1;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"vlinearBounds not implemented for this geometry","");
  *puVar1 = &PTR__rtcore_error_002686f8;
  *(undefined4 *)(puVar1 + 1) = 3;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

virtual LBBox3fa vlinearBounds(size_t primID, const BBox1f& time_range) const {
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"vlinearBounds not implemented for this geometry"); 
    }